

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckMetadataTribbles
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  undefined4 pattern_type_00;
  bool bVar1;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  undefined1 local_c8 [8];
  string message2;
  undefined1 local_a0 [8];
  string message1;
  PatternType pattern_type;
  allocator local_69;
  string local_68 [8];
  string title;
  regex pattern;
  bool ddl_statement;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  bVar1 = IsDDLStatement(sql_statement);
  if (bVar1) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               "[A-za-z\\-_@]+[0-9]+ ",0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Metadata Tribbles",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    message1.field_2._8_4_ = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a0,anon_var_dwarf_5a6f6,
               (allocator *)(message2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(message2.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c8,anon_var_dwarf_5a711,
               (allocator *)(message.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   &local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    std::__cxx11::string::~string((string *)&local_110);
    pattern_type_00 = message1.field_2._8_4_;
    std::__cxx11::string::string((string *)&local_130,local_68);
    std::__cxx11::string::string((string *)&local_150,(string *)local_f0);
    CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
                 RISK_LEVEL_MEDIUM,pattern_type_00,&local_130,&local_150,true,0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  }
  return;
}

Assistant:

void CheckMetadataTribbles(Configuration& state,
                           const std::string& sql_statement,
                           bool& print_statement){

  auto ddl_statement = IsDDLStatement(sql_statement);
  if(ddl_statement == false){
    return;
  }

  std::regex pattern("[A-za-z\\-_@]+[0-9]+ ");
  std::string title = "Metadata Tribbles";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  std::string message1 =
      "● Breaking down a table or column by year/user/etc.:  "
      "You might be trying to split a single column into multiple columns, "
      "using column names based on distinct values in another attribute. "
      "For each year or user, you will need to add one more column or table. "
      "You are mixing metadata with data. You will now need to make sure that "
      "the primary key values are unique across all the split columns or tables. "
      "The solution is to use a feature called sharding or horizontal partitioning. "
      "(PARTITION BY HASH ( YEAR(...) ). With this feature, you can gain the "
      "benefits of splitting a large table without the drawbacks. "
      "Partitioning is not defined in the SQL standard, so each brand of database "
      "implements it in their own nonstandard way. "
      "Another remedy for metadata tribbles is to create a dependent table. "
      "Instead of one row per entity with multiple columns for each year, "
      "use multiple rows. Don't let data spawn metadata.";

  std::string message2 =
      "● Store each value with the same meaning in a single column:  "
      "Creating multiple columns in a table with the same prefix "
      "indicates that you are trying to store a multivalued attribute. "
      "This design makes it hard to add or remove values, "
      "to ensure the uniqueness of values, and handling growing sets of values. "
      "The best solution is to create a dependent table with one column for the "
      "multivalued attribute. Store the multiple values in multiple rows instead of "
      "multiple columns and define a foreign key in the dependent table to associate "
      "the values to its parent row.";

  auto message = message1 + "\n" + message2;

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               true);

}